

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::TracingServiceImpl::ConsumerEndpointImpl::SaveTraceForBugreport
          (ConsumerEndpointImpl *this,SaveTraceForBugreportCallback *consumer_callback)

{
  TracingServiceImpl *this_00;
  bool bVar1;
  allocator<char> local_79;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  anon_class_32_1_639d580e on_complete_callback;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::
  function<void_(bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&on_complete_callback.consumer_callback,consumer_callback);
  this_00 = this->service_;
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_78._M_unused._M_object = operator_new(0x20);
  *(undefined8 *)local_78._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 0x10) = 0;
  *(_Invoker_type *)((long)local_78._M_unused._0_8_ + 0x18) =
       on_complete_callback.consumer_callback._M_invoker;
  if (on_complete_callback.consumer_callback.super__Function_base._M_manager != (_Manager_type)0x0)
  {
    *(void **)local_78._M_unused._0_8_ =
         on_complete_callback.consumer_callback.super__Function_base._M_functor._M_unused._M_object;
    *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) =
         on_complete_callback.consumer_callback.super__Function_base._M_functor._8_8_;
    *(_Manager_type *)((long)local_78._M_unused._0_8_ + 0x10) =
         on_complete_callback.consumer_callback.super__Function_base._M_manager;
    on_complete_callback.consumer_callback.super__Function_base._M_manager = (_Manager_type)0x0;
    on_complete_callback.consumer_callback._M_invoker = (_Invoker_type)0x0;
  }
  pcStack_60 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:59818:31)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:59818:31)>
             ::_M_manager;
  bVar1 = MaybeSaveTraceForBugreport(this_00,(function<void_()> *)&local_78);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_78);
  if (!bVar1) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,
               "No trace with TraceConfig.bugreport_score > 0 eligible for bug reporting was found",
               &local_79);
    std::
    function<void_(bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(consumer_callback,false,&local_38);
    ::std::__cxx11::string::~string((string *)&local_38);
  }
  ::std::_Function_base::~_Function_base((_Function_base *)&on_complete_callback);
  return;
}

Assistant:

void TracingServiceImpl::ConsumerEndpointImpl::SaveTraceForBugreport(
    SaveTraceForBugreportCallback consumer_callback) {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  auto on_complete_callback = [consumer_callback] {
    if (rename(GetBugreportTmpPath().c_str(), GetBugreportPath().c_str())) {
      consumer_callback(false, "rename(" + GetBugreportTmpPath() + ", " +
                                   GetBugreportPath() + ") failed (" +
                                   strerror(errno) + ")");
    } else {
      consumer_callback(true, GetBugreportPath());
    }
  };
  if (!service_->MaybeSaveTraceForBugreport(std::move(on_complete_callback))) {
    consumer_callback(false,
                      "No trace with TraceConfig.bugreport_score > 0 eligible "
                      "for bug reporting was found");
  }
}